

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_ob_data_push(nghttp2_session *session,nghttp2_stream *stream)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  nghttp2_pq *pq;
  int inc;
  uint32_t urgency;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if ((stream->flags & 0x10) == 0) {
    __assert_fail("stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x397,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
  }
  if (stream->queued != '\0') {
    __assert_fail("stream->queued == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x398,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
  }
  uVar2 = stream->extpri & 0xffffff7f;
  bVar1 = stream->extpri;
  if (7 < uVar2) {
    __assert_fail("urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x39d,"int session_ob_data_push(nghttp2_session *, nghttp2_stream *)");
  }
  uVar3 = pq_get_first_cycle(&session->sched[uVar2].ob_data);
  stream->cycle = uVar3;
  if ((bVar1 & 0x80) != 0) {
    stream->cycle = stream->last_writelen + stream->cycle;
  }
  session_local._4_4_ = nghttp2_pq_push(&session->sched[uVar2].ob_data,&stream->pq_entry);
  if (session_local._4_4_ == 0) {
    stream->queued = '\x01';
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int session_ob_data_push(nghttp2_session *session,
                                nghttp2_stream *stream) {
  int rv;
  uint32_t urgency;
  int inc;
  nghttp2_pq *pq;

  assert(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES);
  assert(stream->queued == 0);

  urgency = nghttp2_extpri_uint8_urgency(stream->extpri);
  inc = nghttp2_extpri_uint8_inc(stream->extpri);

  assert(urgency < NGHTTP2_EXTPRI_URGENCY_LEVELS);

  pq = &session->sched[urgency].ob_data;

  stream->cycle = pq_get_first_cycle(pq);
  if (inc) {
    stream->cycle += stream->last_writelen;
  }

  rv = nghttp2_pq_push(pq, &stream->pq_entry);
  if (rv != 0) {
    return rv;
  }

  stream->queued = 1;

  return 0;
}